

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  GestureEvent event;
  long lVar1;
  char cVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  GestureEvent gestureEvent;
  undefined8 auStackY_d8 [3];
  undefined1 in_stack_ffffffffffffff40 [88];
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  
  cVar2 = (char)action;
  CORE.Input.Mouse.currentButtonState[button] = cVar2;
  CORE.Input.Touch.currentTouchState[button] = cVar2;
  uVar5 = 0;
  fVar8 = 0.0;
  if ((cVar2 == '\x01') && (CORE.Input.Mouse.previousButtonState[button] == '\0')) {
    uVar5 = 1;
  }
  else if ((cVar2 == '\0') && (CORE.Input.Mouse.previousButtonState[button] == '\x01')) {
    uVar5 = 0;
  }
  uVar6 = 1;
  uVar7 = 0;
  puVar3 = (undefined8 *)&stack0xffffffffffffff98;
  puVar4 = auStackY_d8;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 1;
  }
  event.position[6].x = (float)uVar5;
  event.touchAction = in_stack_ffffffffffffff40._0_4_;
  event.pointCount = in_stack_ffffffffffffff40._4_4_;
  event.pointId[0] = in_stack_ffffffffffffff40._8_4_;
  event.pointId[1] = in_stack_ffffffffffffff40._12_4_;
  event.pointId[2] = in_stack_ffffffffffffff40._16_4_;
  event.pointId[3] = in_stack_ffffffffffffff40._20_4_;
  event.pointId[4] = in_stack_ffffffffffffff40._24_4_;
  event.pointId[5] = in_stack_ffffffffffffff40._28_4_;
  event.pointId[6] = in_stack_ffffffffffffff40._32_4_;
  event.pointId[7] = in_stack_ffffffffffffff40._36_4_;
  event.position[0].x = (float)(int)in_stack_ffffffffffffff40._40_8_;
  event.position[0].y = (float)(int)((ulong)in_stack_ffffffffffffff40._40_8_ >> 0x20);
  event.position[1].x = (float)(int)in_stack_ffffffffffffff40._48_8_;
  event.position[1].y = (float)(int)((ulong)in_stack_ffffffffffffff40._48_8_ >> 0x20);
  event.position[2].x = (float)(int)in_stack_ffffffffffffff40._56_8_;
  event.position[2].y = (float)(int)((ulong)in_stack_ffffffffffffff40._56_8_ >> 0x20);
  event.position[3].x = (float)(int)in_stack_ffffffffffffff40._64_8_;
  event.position[3].y = (float)(int)((ulong)in_stack_ffffffffffffff40._64_8_ >> 0x20);
  event.position[4].x = (float)(int)in_stack_ffffffffffffff40._72_8_;
  event.position[4].y = (float)(int)((ulong)in_stack_ffffffffffffff40._72_8_ >> 0x20);
  event.position[5].x = (float)(int)in_stack_ffffffffffffff40._80_8_;
  event.position[5].y = (float)(int)((ulong)in_stack_ffffffffffffff40._80_8_ >> 0x20);
  event.position[6].y = (float)uVar6;
  event.position[7].x = (float)uVar7;
  event.position[7].y = fVar8;
  ProcessGestureEvent(event);
  return;
}

Assistant:

static void MouseButtonCallback(GLFWwindow *window, int button, int action, int mods)
{
    // WARNING: GLFW could only return GLFW_PRESS (1) or GLFW_RELEASE (0) for now,
    // but future releases may add more actions (i.e. GLFW_REPEAT)
    CORE.Input.Mouse.currentButtonState[button] = action;
    CORE.Input.Touch.currentTouchState[button] = action;

#if defined(SUPPORT_GESTURES_SYSTEM) && defined(SUPPORT_MOUSE_GESTURES)
    // Process mouse events as touches to be able to use mouse-gestures
    GestureEvent gestureEvent = { 0 };

    // Register touch actions
    if ((CORE.Input.Mouse.currentButtonState[button] == 1) && (CORE.Input.Mouse.previousButtonState[button] == 0)) gestureEvent.touchAction = TOUCH_ACTION_DOWN;
    else if ((CORE.Input.Mouse.currentButtonState[button] == 0) && (CORE.Input.Mouse.previousButtonState[button] == 1)) gestureEvent.touchAction = TOUCH_ACTION_UP;

    // NOTE: TOUCH_ACTION_MOVE event is registered in MouseCursorPosCallback()

    // Assign a pointer ID
    gestureEvent.pointId[0] = 0;

    // Register touch points count
    gestureEvent.pointCount = 1;

    // Register touch points position, only one point registered
    gestureEvent.position[0] = GetMousePosition();

    // Normalize gestureEvent.position[0] for CORE.Window.screen.width and CORE.Window.screen.height
    gestureEvent.position[0].x /= (float)GetScreenWidth();
    gestureEvent.position[0].y /= (float)GetScreenHeight();

    // Gesture data is sent to gestures-system for processing
    ProcessGestureEvent(gestureEvent);
#endif
}